

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cppqc::detail::
  ArbitraryString<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shrink(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x)

{
  pointer pbVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__return_storage_ptr__,x->_M_string_length);
  __end._M_current = (x->_M_dataplus)._M_p;
  while (__end._M_current != (x->_M_dataplus)._M_p + x->_M_string_length) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::reserve
              ((ulong)((__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1));
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::
    insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)(pbVar1 + -1),
               (const_iterator)(pbVar1[-1]._M_dataplus._M_p + pbVar1[-1]._M_string_length),
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(x->_M_dataplus)._M_p,__end);
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    __end._M_current = __end._M_current + 1;
    std::__cxx11::string::
    insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)(pbVar1 + -1),
               (const_iterator)(pbVar1[-1]._M_dataplus._M_p + pbVar1[-1]._M_string_length),__end,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )((x->_M_dataplus)._M_p + x->_M_string_length));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<String> shrink(const String& x) {
    std::vector<String> ret;
    ret.reserve(x.size());
    for (auto it = x.begin(); it != x.end(); ++it) {
      ret.push_back(String());
      ret.back().reserve(x.size() - 1);
      ret.back().insert(ret.back().end(), x.begin(), it);
      ret.back().insert(ret.back().end(), it + 1, x.end());
    }
    return ret;
  }